

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_oh_new_stream(qpdf_data qpdf)

{
  qpdf_data qpdf_00;
  qpdf_oh qVar1;
  QPDFObjectHandle local_20;
  qpdf_data local_10;
  qpdf_data qpdf_local;
  
  local_10 = qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_oh_new_stream",0);
  qpdf_00 = local_10;
  std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_10);
  QPDF::newStream((QPDF *)&local_20);
  qVar1 = new_object(qpdf_00,&local_20);
  QPDFObjectHandle::~QPDFObjectHandle(&local_20);
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_oh_new_stream(qpdf_data qpdf)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_new_stream");
    return new_object(qpdf, qpdf->qpdf->newStream());
}